

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  bool bVar1;
  RegexpStatusCode code;
  ErrorCode EVar2;
  int iVar3;
  void *pvVar4;
  string *psVar5;
  Regexp *pRVar6;
  ostream *poVar7;
  LogMessage *pLVar8;
  Prog *pPVar9;
  string *this_00;
  Prog *in_RDX;
  undefined8 *in_RDI;
  double __x;
  double __x_00;
  Regexp *suffix;
  bool foldcase;
  RegexpStatus status;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  Regexp *in_stack_fffffffffffffb40;
  LogMessage *in_stack_fffffffffffffb50;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb58;
  once_flag *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb70;
  StringPiece *in_stack_fffffffffffffb78;
  char *file;
  LogMessage *in_stack_fffffffffffffb80;
  Regexp *in_stack_fffffffffffffb88;
  RegexpStatus *in_stack_fffffffffffffb98;
  Regexp **in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  string *in_stack_fffffffffffffbb0;
  Regexp *in_stack_fffffffffffffbb8;
  Regexp *in_stack_fffffffffffffbc0;
  undefined1 local_3f1 [225];
  Options *in_stack_fffffffffffffcf0;
  undefined8 local_240;
  byte local_235;
  string local_230 [48];
  re2 local_200 [296];
  RegexpStatus *in_stack_ffffffffffffff28;
  ParseFlags in_stack_ffffffffffffff34;
  StringPiece *in_stack_ffffffffffffff38;
  RegexpStatus local_50;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  std::call_once<re2::RE2::Init(re2::StringPiece_const&,re2::RE2::Options_const&)::__0>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  pvVar4 = operator_new(0x20);
  StringPiece::operator_cast_to_string(in_stack_fffffffffffffb78);
  *in_RDI = pvVar4;
  Options::Copy((Options *)(in_RDI + 1),(Options *)in_RDX);
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  psVar5 = empty_string_abi_cxx11_();
  in_RDI[6] = psVar5;
  psVar5 = empty_string_abi_cxx11_();
  in_RDI[7] = psVar5;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  *(uint *)((long)in_RDI + 0x44) = *(uint *)((long)in_RDI + 0x44) & 0xe0000000;
  bVar1 = Options::longest_match((Options *)(in_RDI + 1));
  *(uint *)((long)in_RDI + 0x44) = *(uint *)((long)in_RDI + 0x44) & 0xdfffffff | (uint)bVar1 << 0x1d
  ;
  *(byte *)((long)in_RDI + 0x47) = *(byte *)((long)in_RDI + 0x47) & 0xbf;
  *(byte *)((long)in_RDI + 0x47) = *(byte *)((long)in_RDI + 0x47) & 0x7f;
  std::__cxx11::string::clear();
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  RegexpStatus::RegexpStatus((RegexpStatus *)in_stack_fffffffffffffb40);
  StringPiece::StringPiece
            ((StringPiece *)in_stack_fffffffffffffb40,
             (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  Options::ParseFlags(in_stack_fffffffffffffcf0);
  pRVar6 = re2::Regexp::Parse(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                              in_stack_ffffffffffffff28);
  in_RDI[4] = pRVar6;
  if (in_RDI[4] == 0) {
    bVar1 = Options::log_errors((Options *)(in_RDI + 1));
    if (bVar1) {
      LogMessage::LogMessage(in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,iVar3);
      poVar7 = LogMessage::stream((LogMessage *)(local_200 + 0x20));
      poVar7 = std::operator<<(poVar7,"Error parsing \'");
      StringPiece::StringPiece
                ((StringPiece *)in_stack_fffffffffffffb40,
                 (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      trunc_abi_cxx11_(local_200,__x);
      poVar7 = std::operator<<(poVar7,(string *)local_200);
      poVar7 = std::operator<<(poVar7,"\': ");
      RegexpStatus::Text_abi_cxx11_(in_stack_fffffffffffffb98);
      std::operator<<(poVar7,local_230);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string((string *)local_200);
      LogMessage::~LogMessage(in_stack_fffffffffffffb50);
    }
    pvVar4 = operator_new(0x20);
    RegexpStatus::Text_abi_cxx11_(in_stack_fffffffffffffb98);
    in_RDI[6] = pvVar4;
    code = RegexpStatus::code(&local_50);
    EVar2 = RegexpErrorToRE2(code);
    *(ErrorCode *)((long)in_RDI + 0x44) =
         *(ErrorCode *)((long)in_RDI + 0x44) & 0xe0000000 | EVar2 & 0x1fffffff;
    pvVar4 = operator_new(0x20);
    RegexpStatus::error_arg(&local_50);
    StringPiece::operator_cast_to_string(in_stack_fffffffffffffb78);
    in_RDI[7] = pvVar4;
  }
  else {
    bVar1 = re2::Regexp::RequiredPrefix
                      (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                       (bool *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                       in_stack_fffffffffffffba0);
    if (bVar1) {
      *(uint *)((long)in_RDI + 0x44) =
           *(uint *)((long)in_RDI + 0x44) & 0x7fffffff | (uint)(local_235 & 1) << 0x1f;
      in_RDI[5] = local_240;
    }
    else {
      pRVar6 = re2::Regexp::Incref(in_stack_fffffffffffffb88);
      in_RDI[5] = pRVar6;
    }
    file = (char *)in_RDI[5];
    pLVar8 = (LogMessage *)Options::max_mem((Options *)(in_RDI + 1));
    pPVar9 = re2::Regexp::CompileToProg
                       (in_stack_fffffffffffffb40,
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    in_RDI[0xd] = pPVar9;
    if (in_RDI[0xd] == 0) {
      bVar1 = Options::log_errors((Options *)(in_RDI + 1));
      if (bVar1) {
        LogMessage::LogMessage(pLVar8,file,(int)((ulong)pPVar9 >> 0x20));
        poVar7 = LogMessage::stream((LogMessage *)(local_3f1 + 0x31));
        poVar7 = std::operator<<(poVar7,"Error compiling \'");
        StringPiece::StringPiece
                  ((StringPiece *)in_stack_fffffffffffffb40,
                   (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        trunc_abi_cxx11_((re2 *)(local_3f1 + 0x11),__x_00);
        pLVar8 = (LogMessage *)std::operator<<(poVar7,(string *)(local_3f1 + 0x11));
        std::operator<<((ostream *)pLVar8,"\'");
        std::__cxx11::string::~string((string *)(local_3f1 + 0x11));
        LogMessage::~LogMessage(pLVar8);
      }
      this_00 = (string *)operator_new(0x20);
      in_stack_fffffffffffffb40 = (Regexp *)local_3f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (this_00,"pattern too large - compile failed",(allocator *)in_stack_fffffffffffffb40
                );
      in_RDI[6] = this_00;
      std::allocator<char>::~allocator((allocator<char> *)local_3f1);
      *(uint *)((long)in_RDI + 0x44) = *(uint *)((long)in_RDI + 0x44) & 0xe0000000 | 0xf;
    }
    else {
      iVar3 = re2::Regexp::NumCaptures(in_stack_fffffffffffffbc0);
      *(int *)(in_RDI + 8) = iVar3;
      bVar1 = Prog::IsOnePass(in_RDX);
      *(uint *)((long)in_RDI + 0x44) =
           *(uint *)((long)in_RDI + 0x44) & 0xbfffffff | (uint)bVar1 << 0x1e;
    }
  }
  RegexpStatus::~RegexpStatus((RegexpStatus *)in_stack_fffffffffffffb40);
  return;
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    (void) new (empty_storage) EmptyStorage;
  });

  pattern_ = new std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  error_ = empty_string();
  error_arg_ = empty_string();

  num_captures_ = -1;
  error_code_ = NoError;
  longest_match_ = options_.longest_match();
  is_one_pass_ = false;
  prefix_foldcase_ = false;
  prefix_.clear();
  prog_ = NULL;

  rprog_ = NULL;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    *pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(*pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = new std::string(status.error_arg());
    return;
  }

  bool foldcase;
  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &foldcase, &suffix)) {
    prefix_foldcase_ = foldcase;
    suffix_regexp_ = suffix;
  }
  else {
    suffix_regexp_ = entire_regexp_->Incref();
  }

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(*pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}